

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O3

void Gia_Iso2ManCollectOrder
               (Gia_Man_t *pGia,int *pPos,int nPos,Vec_Int_t *vRoots,Vec_Int_t *vVec,Vec_Int_t *vMap
               )

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  
  vRoots->nSize = 0;
  if (0 < nPos) {
    uVar3 = 0;
    do {
      uVar1 = pPos[uVar3];
      iVar2 = pGia->vCos->nSize;
      if (iVar2 - pGia->nRegs <= (int)uVar1) {
        __assert_fail("v < Gia_ManPoNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
      }
      if (((int)uVar1 < 0) || (iVar2 <= (int)uVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pGia->vCos->pArray[uVar1];
      if ((iVar2 < 0) || (pGia->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      Vec_IntPush(vRoots,iVar2);
      uVar3 = uVar3 + 1;
    } while ((uint)nPos != uVar3);
  }
  vVec->nSize = 0;
  Gia_ManIncrementTravId(pGia);
  if (0 < vRoots->nSize) {
    lVar4 = 0;
    do {
      Gia_Iso2ManCollectOrder_rec(pGia,vRoots->pArray[lVar4],vRoots,vVec,vMap);
      lVar4 = lVar4 + 1;
    } while (lVar4 < vRoots->nSize);
  }
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder( Gia_Man_t * pGia, int * pPos, int nPos, Vec_Int_t * vRoots, Vec_Int_t * vVec, Vec_Int_t * vMap )
{
    int i, iRoot;
    Vec_IntClear( vRoots );
    for ( i = 0; i < nPos; i++ )
        Vec_IntPush( vRoots, Gia_ObjId(pGia, Gia_ManPo(pGia, pPos[i])) );
    Vec_IntClear( vVec );
    Gia_ManIncrementTravId( pGia );
    Vec_IntForEachEntry( vRoots, iRoot, i )
        Gia_Iso2ManCollectOrder_rec( pGia, iRoot, vRoots, vVec, vMap );
}